

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::CaptureNoImplicitCallUses
          (GlobOpt *this,Opnd *opnd,bool usesNoMissingValuesInfo,Instr *includeCurrentInstr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PragmaInstr *this_00;
  Opnd *pOVar4;
  Instr *noImplicitCallUses;
  Instr *pIStack_28;
  ValueType valueType;
  Instr *includeCurrentInstr_local;
  Opnd *pOStack_18;
  bool usesNoMissingValuesInfo_local;
  Opnd *opnd_local;
  GlobOpt *this_local;
  
  pIStack_28 = includeCurrentInstr;
  pOStack_18 = opnd;
  opnd_local = (Opnd *)this;
  bVar2 = IsLoopPrePass(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3510,"(!IsLoopPrePass())","!IsLoopPrePass()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->noImplicitCallUsesToInsert == (OpndList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3511,"(noImplicitCallUsesToInsert)","noImplicitCallUsesToInsert");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (pOStack_18 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3512,"(opnd)","opnd");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOStack_18 = IR::Opnd::Copy(pOStack_18,this->func);
  if (!usesNoMissingValuesInfo) {
    noImplicitCallUses._6_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(pOStack_18);
    bVar2 = ValueType::IsArrayOrObjectWithArray((ValueType *)((long)&noImplicitCallUses + 6));
    if ((bVar2) &&
       (bVar2 = ValueType::HasNoMissingValues((ValueType *)((long)&noImplicitCallUses + 6)),
       pOVar4 = pOStack_18, bVar2)) {
      noImplicitCallUses._4_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetHasNoMissingValues((ValueType *)((long)&noImplicitCallUses + 6),false);
      IR::Opnd::SetValueType(pOVar4,(ValueType)noImplicitCallUses._4_2_);
    }
  }
  if (pIStack_28 == (Instr *)0x0) {
    JsUtil::
    List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
              (this->noImplicitCallUsesToInsert,&stack0xffffffffffffffe8);
  }
  else {
    this_00 = IR::PragmaInstr::New(NoImplicitCallUses,0,pIStack_28->m_func);
    IR::Instr::SetSrc1(&this_00->super_Instr,pOStack_18);
    pOVar4 = IR::Instr::GetSrc1(&this_00->super_Instr);
    IR::Opnd::SetIsJITOptimizedReg(pOVar4,true);
    IR::Instr::InsertAfter(pIStack_28,&this_00->super_Instr);
  }
  return;
}

Assistant:

void
GlobOpt::CaptureNoImplicitCallUses(
    IR::Opnd *opnd,
    const bool usesNoMissingValuesInfo,
    IR::Instr *const includeCurrentInstr)
{
    Assert(!IsLoopPrePass());
    Assert(noImplicitCallUsesToInsert);
    Assert(opnd);

    // The opnd may be deleted later, so make a copy to ensure it is alive for inserting NoImplicitCallUses later
    opnd = opnd->Copy(func);

    if(!usesNoMissingValuesInfo)
    {
        const ValueType valueType(opnd->GetValueType());
        if(valueType.IsArrayOrObjectWithArray() && valueType.HasNoMissingValues())
        {
            // Inserting NoImplicitCallUses for an opnd with a definitely-array-with-no-missing-values value type means that the
            // instruction following it uses the information that the array has no missing values in some way, for instance, it
            // may omit missing value checks. Based on that, the dead-store phase in turn ensures that the necessary bailouts
            // are inserted to ensure that the array still has no missing values until the following instruction. Since
            // 'usesNoMissingValuesInfo' is false, change the value type to indicate to the dead-store phase that the following
            // instruction does not use the no-missing-values information.
            opnd->SetValueType(valueType.SetHasNoMissingValues(false));
        }
    }

    if(includeCurrentInstr)
    {
        IR::Instr *const noImplicitCallUses =
            IR::PragmaInstr::New(Js::OpCode::NoImplicitCallUses, 0, includeCurrentInstr->m_func);
        noImplicitCallUses->SetSrc1(opnd);
        noImplicitCallUses->GetSrc1()->SetIsJITOptimizedReg(true);
        includeCurrentInstr->InsertAfter(noImplicitCallUses);
        return;
    }

    noImplicitCallUsesToInsert->Add(opnd);
}